

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O1

Var Js::CrossSite::MarshalVarInner
              (ScriptContext *scriptContext,RecyclableObject *object,bool fRequestWrapper)

{
  TypeId typeId;
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  JavascriptCopyOnAccessNativeIntArray *this;
  undefined4 extraout_var;
  HostObjectBase *pHVar9;
  Var value;
  JavascriptExternalFunction *obj;
  RootObjectBase *moduleRoot;
  
  pSVar1 = (((((object->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (pSVar1 == scriptContext) {
    bVar4 = DoRequestWrapper(object,fRequestWrapper);
    if (!bVar4) {
      return object;
    }
    return (JavascriptExternalFunction *)
           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  if (scriptContext->threadContext != pSVar1->threadContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0xf0,
                                "(scriptContext->GetThreadContext() == object->GetScriptContext()->GetThreadContext())"
                                ,
                                "ScriptContexts should belong to same threadcontext for marshalling."
                               );
    if (!bVar4) goto LAB_007615b4;
    *puVar8 = 0;
  }
  bVar4 = Memory::Recycler::IsHeapEnumInProgress(scriptContext->recycler);
  if (bVar4) {
    return object;
  }
  if (scriptContext->TTDSnapshotOrInflateInProgress != false) {
    return object;
  }
  pTVar2 = scriptContext->threadContext;
  bVar4 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  if (object != (RecyclableObject *)0x0) {
    bVar5 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(object);
    if (bVar5) {
      this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(object);
    }
    else {
      this = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (this != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
    }
  }
  typeId = ((object->type).ptr)->typeId;
  if (typeId == TypeIds_UnscopablesWrapperObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x113,"(typeId != TypeIds_UnscopablesWrapperObject)",
                                "UnscopablesWrapperObject shouldn\'t be marshalled here");
    if (!bVar5) {
LAB_007615b4:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  else if (typeId == TypeIds_Enumerator) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x107,"(typeId != TypeIds_Enumerator)",
                                "enumerator shouldn\'t be marshalled here");
    if (!bVar5) goto LAB_007615b4;
    *puVar8 = 0;
  }
  bVar5 = StaticType::Is(typeId);
  if (bVar5) {
    iVar6 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x58])(object,scriptContext);
    obj = (JavascriptExternalFunction *)CONCAT44(extraout_var,iVar6);
    goto LAB_00761437;
  }
  if (typeId == TypeIds_Function) {
    if ((((((((((object->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
        super_JavascriptLibraryBase).defaultAccessorFunction.ptr == (JavascriptFunction *)object) {
      obj = (JavascriptExternalFunction *)
            (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
            super_JavascriptLibraryBase).defaultAccessorFunction.ptr;
      goto LAB_00761437;
    }
    bVar5 = DoRequestWrapper(object,fRequestWrapper);
    if (bVar5) {
      MarshalVarInner(scriptContext,object,false);
      obj = JavascriptLibrary::CreateWrappedExternalFunction
                      ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                       (JavascriptExternalFunction *)object);
      goto LAB_00761437;
    }
  }
  else if ((typeId == TypeIds_LastTrueJavascriptObjectType) &&
          (pHVar9 = RootObjectBase::GetHostObject((RootObjectBase *)object),
          pHVar9 != (HostObjectBase *)0x0)) {
    value = (Var)(**(code **)(*(long *)pHVar9 + 0x2b8))(pHVar9);
    obj = (JavascriptExternalFunction *)MarshalVar(scriptContext,value,false);
    goto LAB_00761437;
  }
  ScriptContextOptimizationOverrideInfo::Merge
            (&scriptContext->optimizationOverrides,
             &((((((object->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr)->optimizationOverrides);
  obj = (JavascriptExternalFunction *)VarTo<Js::DynamicObject,Js::RecyclableObject>(object);
  BVar7 = RecyclableObject::IsExternal((RecyclableObject *)obj);
  if (BVar7 == 0) {
    iVar6 = (*(obj->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x66])(obj);
    if (iVar6 == 0) {
      bVar5 = VarIs<Js::JavascriptProxy,Js::DynamicObject>((DynamicObject *)obj);
      if (bVar5) {
        MarshalDynamicObject(scriptContext,(DynamicObject *)obj);
      }
      else {
        MarshalDynamicObject(scriptContext,(DynamicObject *)obj);
        MarshalPrototypeChain(scriptContext,(DynamicObject *)obj);
      }
    }
  }
  else {
    MarshalPrototypeChain(scriptContext,(DynamicObject *)obj);
    bVar5 = JavascriptConversion::IsCallable((RecyclableObject *)obj);
    if (bVar5) {
      (*(obj->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
        super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x61])(obj,scriptContext);
    }
  }
LAB_00761437:
  pTVar2->noJsReentrancy = bVar4;
  return obj;
}

Assistant:

Var CrossSite::MarshalVarInner(ScriptContext* scriptContext, __in Js::RecyclableObject* object, bool fRequestWrapper)
    {
        if (scriptContext == object->GetScriptContext())
        {
            if (DoRequestWrapper(object, fRequestWrapper))
            {
                // If we get here then we need to either wrap in the caller's type system or we need to return undefined.
                // VBScript will pass in the scriptContext (requestContext) from the JavascriptDispatch and this will be the
                // same as the object's script context and so we have to safely pretend this value doesn't exist.
                return scriptContext->GetLibrary()->GetUndefined();
            }
            return object;
        }

        AssertMsg(scriptContext->GetThreadContext() == object->GetScriptContext()->GetThreadContext(), "ScriptContexts should belong to same threadcontext for marshalling.");
        // In heapenum, we are traversing through the object graph to dump out the content of recyclable objects. The content
        // of the objects are duplicated to the heapenum result, and we are not storing/changing the object graph during heap enum.
        // We don't actually need to do cross site thunk here.
        if (scriptContext->GetRecycler()->IsHeapEnumInProgress())
        {
            return object;
        }

#if ENABLE_TTD
        if (scriptContext->IsTTDSnapshotOrInflateInProgress())
        {
            return object;
        }
#endif

        // Marshaling should not cause any re-entrancy.
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(object);
#endif
        TypeId typeId = object->GetTypeId();
        AssertMsg(typeId != TypeIds_Enumerator, "enumerator shouldn't be marshalled here");

        // At the moment the mental model for UnscopablesWrapperObject Marshaling is this:
        // Are we trying to marshal a UnscopablesWrapperObject in the Frame Display? - then 1) unwrap in MarshalFrameDisplay,
        // 2) marshal the wrapped object, 3) Create a new UnscopablesWrapperObject in the current scriptContext and re-wrap.
        // We can avoid copying the UnscopablesWrapperObject because it has no properties and never should.
        // Thus creating a new UnscopablesWrapperObject per context in MarshalFrameDisplay should be kosher.
        // If it is not a FrameDisplay then we should not marshal. We can wrap cross context objects with a
        // UnscopablesWrapperObject in a different context. When we unwrap for property lookups and the wrapped object
        // is cross context, then we marshal the wrapped object into the current scriptContext, thus avoiding
        // the need to copy the UnscopablesWrapperObject itself. Thus We don't have to handle marshaling the UnscopablesWrapperObject
        // in non-FrameDisplay cases.
        AssertMsg(typeId != TypeIds_UnscopablesWrapperObject, "UnscopablesWrapperObject shouldn't be marshalled here");

        if (StaticType::Is(typeId))
        {
            TTD_XSITE_LOG(object->GetScriptContext(), "CloneToScriptContext", object);

            return object->CloneToScriptContext(scriptContext);
        }

        if (typeId == TypeIds_ModuleRoot)
        {
            RootObjectBase *moduleRoot = static_cast<RootObjectBase*>(object);
            HostObjectBase * hostObject = moduleRoot->GetHostObject();

            // When marshaling module root, all we need is the host object.
            // So, if the module root which is being marshaled has host object, marshal it.
            if (hostObject)
            {
                TTD_XSITE_LOG(object->GetScriptContext(), "hostObject", hostObject);

                Var hostDispatch = hostObject->GetHostDispatchVar();
                return CrossSite::MarshalVar(scriptContext, hostDispatch);
            }
        }

        if (typeId == TypeIds_Function)
        {
            if (object == object->GetScriptContext()->GetLibrary()->GetDefaultAccessorFunction() )
            {
                TTD_XSITE_LOG(object->GetScriptContext(), "DefaultAccessorFunction", object);

                return scriptContext->GetLibrary()->GetDefaultAccessorFunction();
            }

            if (DoRequestWrapper(object, fRequestWrapper))
            {
                TTD_XSITE_LOG(object->GetScriptContext(), "CreateWrappedExternalFunction", object);

                // Marshal as a cross-site thunk if necessary before re-wrapping in an external function thunk.
                MarshalVarInner(scriptContext, object, false);
                return scriptContext->GetLibrary()->CreateWrappedExternalFunction(static_cast<JavascriptExternalFunction*>(object));
            }
        }

        // We have an object marshaled, we need to keep track of the related script context
        // so optimization overrides can be updated as a group
        scriptContext->optimizationOverrides.Merge(&object->GetScriptContext()->optimizationOverrides);

        DynamicObject * dynamicObject = VarTo<DynamicObject>(object);
        if (!dynamicObject->IsExternal())
        {
            if (!dynamicObject->IsCrossSiteObject())
            {
                if (VarIs<JavascriptProxy>(dynamicObject))
                {
                    // We don't need to marshal the prototype chain in the case of Proxy. Otherwise we will go to the user code.
                    TTD_XSITE_LOG(object->GetScriptContext(), "MarshalDynamicObject", object);
                    MarshalDynamicObject(scriptContext, dynamicObject);
                }
                else
                {
                    TTD_XSITE_LOG(object->GetScriptContext(), "MarshalDynamicObjectAndPrototype", object);

                    MarshalDynamicObjectAndPrototype(scriptContext, dynamicObject);
                }
            }
        }
        else
        {
            MarshalPrototypeChain(scriptContext, dynamicObject);
            if (Js::JavascriptConversion::IsCallable(dynamicObject))
            {
                TTD_XSITE_LOG(object->GetScriptContext(), "MarshalToScriptContext", object);

                dynamicObject->MarshalToScriptContext(scriptContext);
            }
        }

        return dynamicObject;
    }